

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListAppendVector(Parse *pParse,ExprList *pList,IdList *pColumns,Expr *pExpr)

{
  uint uVar1;
  sqlite3 *db_00;
  long lVar2;
  uint uVar3;
  Expr *pExpr_00;
  int local_54;
  Expr *pFirst;
  Expr *pSubExpr;
  int local_38;
  int iFirst;
  int i;
  int n;
  sqlite3 *db;
  Expr *pExpr_local;
  IdList *pColumns_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pList == (ExprList *)0x0) {
    local_54 = 0;
  }
  else {
    local_54 = pList->nExpr;
  }
  db = (sqlite3 *)pExpr;
  pColumns_local = (IdList *)pList;
  if ((pColumns != (IdList *)0x0) && (pExpr != (Expr *)0x0)) {
    if ((pExpr->op == 0x83) ||
       (uVar1 = pColumns->nId, uVar3 = sqlite3ExprVectorSize(pExpr), uVar1 == uVar3)) {
      for (local_38 = 0; local_38 < pColumns->nId; local_38 = local_38 + 1) {
        pExpr_00 = sqlite3ExprForVectorField(pParse,pExpr,local_38);
        pColumns_local = (IdList *)sqlite3ExprListAppend(pParse,(ExprList *)pColumns_local,pExpr_00)
        ;
        if ((ExprList *)pColumns_local != (ExprList *)0x0) {
          ((ExprList *)pColumns_local)->a[((ExprList *)pColumns_local)->nExpr + -1].zName =
               pColumns->a[local_38].zName;
          pColumns->a[local_38].zName = (char *)0x0;
        }
      }
      if (((db_00->mallocFailed == '\0') && (pExpr->op == 0x83)) &&
         (pColumns_local != (IdList *)0x0)) {
        lVar2 = *(long *)&pColumns_local[(long)local_54 * 2].nId;
        *(Expr **)(lVar2 + 0x18) = pExpr;
        db = (sqlite3 *)0x0;
        *(int *)(lVar2 + 0x2c) = pColumns->nId;
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"%d columns assigned %d values",(ulong)(uint)pColumns->nId,(ulong)uVar3
                     );
    }
  }
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprUnmap(pParse,(Expr *)db);
  }
  sqlite3ExprDelete(db_00,(Expr *)db);
  sqlite3IdListDelete(db_00,pColumns);
  return (ExprList *)pColumns_local;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppendVector(
  Parse *pParse,         /* Parsing context */
  ExprList *pList,       /* List to which to append. Might be NULL */
  IdList *pColumns,      /* List of names of LHS of the assignment */
  Expr *pExpr            /* Vector expression to be appended. Might be NULL */
){
  sqlite3 *db = pParse->db;
  int n;
  int i;
  int iFirst = pList ? pList->nExpr : 0;
  /* pColumns can only be NULL due to an OOM but an OOM will cause an
  ** exit prior to this routine being invoked */
  if( NEVER(pColumns==0) ) goto vector_append_error;
  if( pExpr==0 ) goto vector_append_error;

  /* If the RHS is a vector, then we can immediately check to see that 
  ** the size of the RHS and LHS match.  But if the RHS is a SELECT, 
  ** wildcards ("*") in the result set of the SELECT must be expanded before
  ** we can do the size check, so defer the size check until code generation.
  */
  if( pExpr->op!=TK_SELECT && pColumns->nId!=(n=sqlite3ExprVectorSize(pExpr)) ){
    sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                    pColumns->nId, n);
    goto vector_append_error;
  }

  for(i=0; i<pColumns->nId; i++){
    Expr *pSubExpr = sqlite3ExprForVectorField(pParse, pExpr, i);
    pList = sqlite3ExprListAppend(pParse, pList, pSubExpr);
    if( pList ){
      assert( pList->nExpr==iFirst+i+1 );
      pList->a[pList->nExpr-1].zName = pColumns->a[i].zName;
      pColumns->a[i].zName = 0;
    }
  }

  if( !db->mallocFailed && pExpr->op==TK_SELECT && ALWAYS(pList!=0) ){
    Expr *pFirst = pList->a[iFirst].pExpr;
    assert( pFirst!=0 );
    assert( pFirst->op==TK_SELECT_COLUMN );
     
    /* Store the SELECT statement in pRight so it will be deleted when
    ** sqlite3ExprListDelete() is called */
    pFirst->pRight = pExpr;
    pExpr = 0;

    /* Remember the size of the LHS in iTable so that we can check that
    ** the RHS and LHS sizes match during code generation. */
    pFirst->iTable = pColumns->nId;
  }

vector_append_error:
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprUnmap(pParse, pExpr);
  }
  sqlite3ExprDelete(db, pExpr);
  sqlite3IdListDelete(db, pColumns);
  return pList;
}